

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlevdur.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  string *this;
  char *__s;
  size_type __n;
  bool bVar6;
  int num_order;
  ReverseLevinsonDurbinRecursion reverse_levinson_durbin_recursion;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  vector<double,_std::allocator<double>_> autocorrelation;
  ostringstream error_message_3;
  Buffer buffer;
  ifstream ifs;
  int local_474;
  string local_470;
  ReverseLevinsonDurbinRecursion local_450;
  vector<double,_std::allocator<double>_> local_440;
  vector<double,_std::allocator<double>_> local_428;
  string local_410 [3];
  ios_base local_3a0 [264];
  Buffer local_298;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_474 = 0x19;
  while (iVar4 = ya_getopt_long(argc,argv,"m:h",(option *)0x0,(int *)0x0), iVar4 == 0x6d) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_410);
    bVar2 = sptk::ConvertStringToInteger(&local_238,&local_474);
    bVar6 = local_474 < 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar2 || bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_410[0]._M_dataplus._M_p = (pointer)&local_410[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"rlevdur","");
      sptk::PrintErrorMessage(local_410,(ostringstream *)&local_238);
LAB_001039ce:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410[0]._M_dataplus._M_p != &local_410[0].field_2) {
        operator_delete(local_410[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
  }
  if (iVar4 != -1) {
    if (iVar4 != 0x68) {
      anon_unknown.dwarf_2c86::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2c86::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_410[0]._M_dataplus._M_p = (pointer)&local_410[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"rlevdur","");
    sptk::PrintErrorMessage(local_410,(ostringstream *)&local_238);
    goto LAB_001039ce;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar2 = sptk::SetBinaryMode();
  this = &local_238;
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_410[0]._M_dataplus._M_p = (pointer)&local_410[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"rlevdur","");
    sptk::PrintErrorMessage(local_410,(ostringstream *)&local_238);
    goto LAB_001039ce;
  }
  std::ifstream::ifstream(this);
  if ((__s == (char *)0x0) ||
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      this = (string *)&std::cin;
    }
    sptk::ReverseLevinsonDurbinRecursion::ReverseLevinsonDurbinRecursion(&local_450,local_474);
    local_298._vptr_Buffer = (_func_int **)&PTR__Buffer_0010fc98;
    sptk::SymmetricMatrix::SymmetricMatrix(&local_298.u_,0);
    local_298.e_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_298.e_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_298.e_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    if (local_450.is_valid_ == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_410,"Failed to initialize ReverseLevinsonDurbinRecursion",0x33);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"rlevdur","");
      sptk::PrintErrorMessage(&local_470,(ostringstream *)local_410);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base(local_3a0);
      iVar4 = 1;
    }
    else {
      __n = (long)local_474 + 1;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_428,__n,(allocator_type *)local_410);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_440,__n,(allocator_type *)local_410);
      do {
        bVar2 = sptk::ReadStream<double>(false,0,0,(int)__n,&local_440,(istream *)this,(int *)0x0);
        if (!bVar2) {
          iVar4 = 0;
          goto LAB_00103c79;
        }
        bVar2 = sptk::ReverseLevinsonDurbinRecursion::Run
                          (&local_450,&local_440,&local_428,&local_298);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_410,"Failed to solve autocorrelation normal equations",0x30);
          local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"rlevdur","");
          sptk::PrintErrorMessage(&local_470,(ostringstream *)local_410);
          goto LAB_00103c47;
        }
        bVar2 = sptk::WriteStream<double>(0,(int)__n,&local_428,(ostream *)&std::cout,(int *)0x0);
      } while (bVar2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_410,"Failed to write autocorrelation",0x1f);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"rlevdur","");
      sptk::PrintErrorMessage(&local_470,(ostringstream *)local_410);
LAB_00103c47:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base(local_3a0);
      iVar4 = 1;
LAB_00103c79:
      if (local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    sptk::ReverseLevinsonDurbinRecursion::Buffer::~Buffer(&local_298);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_410,"Cannot open file ",0x11);
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,__s,sVar5);
    piVar1 = &local_298.u_.num_dimension_;
    local_298._vptr_Buffer = (_func_int **)piVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"rlevdur","");
    sptk::PrintErrorMessage((string *)&local_298,(ostringstream *)local_410);
    if (local_298._vptr_Buffer != (_func_int **)piVar1) {
      operator_delete(local_298._vptr_Buffer);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
    std::ios_base::~ios_base(local_3a0);
    iVar4 = 1;
  }
  std::ifstream::~ifstream(&local_238);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("rlevdur", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ReverseLevinsonDurbinRecursion reverse_levinson_durbin_recursion(
      num_order);
  sptk::ReverseLevinsonDurbinRecursion::Buffer buffer;
  if (!reverse_levinson_durbin_recursion.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize ReverseLevinsonDurbinRecursion";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> autocorrelation(length);
  std::vector<double> linear_predictive_coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &linear_predictive_coefficients,
                          &input_stream, NULL)) {
    if (!reverse_levinson_durbin_recursion.Run(linear_predictive_coefficients,
                                               &autocorrelation, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to solve autocorrelation normal equations";
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, autocorrelation, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write autocorrelation";
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }
  }

  return 0;
}